

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall QPDFWriter::copyEncryptionParameters(QPDFWriter *this,QPDF *qpdf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  bool bVar3;
  int V;
  int iVar4;
  longlong lVar5;
  string *user_password;
  int iVar6;
  string OE;
  long *local_1f8 [2];
  long local_1e8 [2];
  QPDFObjectHandle encrypt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  QPDFObjectHandle local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  string UE;
  string Perms;
  QPDFObjectHandle trailer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  long local_f8 [2];
  string encryption_key;
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  preserve_encryption = false;
  QPDF::getTrailer(qpdf);
  paVar1 = &OE.field_2;
  OE._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/Encrypt","");
  bVar3 = QPDFObjectHandle::hasKey(&trailer,&OE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)OE._M_dataplus._M_p != paVar1) {
    operator_delete(OE._M_dataplus._M_p,
                    CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) + 1)
    ;
  }
  if (bVar3) {
    generateID(this);
    local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"/ID","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&Perms,(string *)&trailer);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&UE,(int)&Perms);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&OE,(QPDFObjectHandle *)&UE);
    std::__cxx11::string::operator=
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->id1,(string *)&OE);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    if (UE._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UE._M_string_length);
    }
    if (Perms._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Perms._M_string_length);
    }
    if (local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_198) {
      operator_delete(local_1a8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_198._0_8_ + 1);
    }
    OE._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/Encrypt","");
    QPDFObjectHandle::getKey(&encrypt,(string *)&trailer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    OE._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/V","");
    QPDFObjectHandle::getKey(&local_1a8,(string *)&encrypt);
    V = QPDFObjectHandle::getIntValueAsInt(&local_1a8);
    if (local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    iVar6 = 5;
    if (1 < V) {
      OE._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/Length","");
      QPDFObjectHandle::getKey(&local_1a8,(string *)&encrypt);
      iVar4 = QPDFObjectHandle::getIntValueAsInt(&local_1a8);
      iVar6 = iVar4 + 7;
      if (-1 < iVar4) {
        iVar6 = iVar4;
      }
      if (local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)OE._M_dataplus._M_p != paVar1) {
        operator_delete(OE._M_dataplus._M_p,
                        CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0])
                        + 1);
      }
      iVar6 = iVar6 >> 3;
    }
    OE._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/EncryptMetadata","");
    bVar3 = QPDFObjectHandle::hasKey(&encrypt,&OE);
    if (bVar3) {
      local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"/EncryptMetadata","");
      QPDFObjectHandle::getKey(&local_80,(string *)&encrypt);
      bVar3 = QPDFObjectHandle::isBool(&local_80);
      if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_198) {
        operator_delete(local_1a8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_198._0_8_ + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != paVar1) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    if (bVar3 != false) {
      OE._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&OE,"/EncryptMetadata","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&UE,(string *)&encrypt);
      bVar3 = QPDFObjectHandle::getBoolValue((QPDFObjectHandle *)&UE);
      ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      encrypt_metadata = bVar3;
      if (UE._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UE._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)OE._M_dataplus._M_p != paVar1) {
        operator_delete(OE._M_dataplus._M_p,
                        CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0])
                        + 1);
      }
    }
    if (3 < V) {
      ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      encrypt_use_aes = true;
    }
    OE._M_string_length = 0;
    OE.field_2._M_local_buf[0] = '\0';
    UE._M_dataplus._M_p = (pointer)&UE.field_2;
    UE._M_string_length = 0;
    UE.field_2._M_local_buf[0] = '\0';
    Perms._M_dataplus._M_p = (pointer)&Perms.field_2;
    Perms._M_string_length = 0;
    Perms.field_2._M_local_buf[0] = '\0';
    encryption_key._M_dataplus._M_p = (pointer)&encryption_key.field_2;
    encryption_key._M_string_length = 0;
    encryption_key.field_2._M_local_buf[0] = '\0';
    OE._M_dataplus._M_p = (pointer)paVar1;
    if (4 < V) {
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/OE","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_188,(string *)&encrypt);
      QPDFObjectHandle::getStringValue_abi_cxx11_
                ((string *)&local_1c8,(QPDFObjectHandle *)local_188);
      std::__cxx11::string::operator=((string *)&OE,(string *)local_1c8._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1)
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/UE","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_188,(string *)&encrypt);
      QPDFObjectHandle::getStringValue_abi_cxx11_
                ((string *)&local_1c8,(QPDFObjectHandle *)local_188);
      std::__cxx11::string::operator=((string *)&UE,(string *)local_1c8._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1)
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/Perms","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_188,(string *)&encrypt);
      QPDFObjectHandle::getStringValue_abi_cxx11_
                ((string *)&local_1c8,(QPDFObjectHandle *)local_188);
      std::__cxx11::string::operator=((string *)&Perms,(string *)local_1c8._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1)
        ;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      QPDF::getEncryptionKey_abi_cxx11_((string *)&local_1c8,qpdf);
      std::__cxx11::string::operator=((string *)&encryption_key,(string *)local_1c8._M_local_buf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_allocated_capacity != &local_1b8) {
        operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1)
        ;
      }
    }
    local_1c8._M_allocated_capacity = (size_type)&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"/R","");
    QPDFObjectHandle::getKey(&local_90,(string *)&encrypt);
    iVar4 = QPDFObjectHandle::getIntValueAsInt(&local_90);
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"/P","");
    QPDFObjectHandle::getKey(&local_a0,(string *)&encrypt);
    lVar5 = QPDFObjectHandle::getIntValue(&local_a0);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/O","");
    QPDFObjectHandle::getKey(&local_b0,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_((string *)local_188,&local_b0);
    local_108._M_allocated_capacity = (size_type)local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/U","");
    QPDFObjectHandle::getKey(&local_c0,(string *)&encrypt);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_50,&local_c0);
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    user_password = QPDF::getPaddedUserPassword_abi_cxx11_(qpdf);
    setEncryptionParametersInternal
              (this,V,iVar4,iVar6,(int)lVar5,(string *)local_188,&local_50,&OE,&UE,&Perms,
               &peVar2->id1,user_password,&encryption_key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_c0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((long *)local_108._M_allocated_capacity != local_f8) {
      operator_delete((void *)local_108._M_allocated_capacity,local_f8[0] + 1);
    }
    if ((element_type *)local_188._0_8_ != (element_type *)local_178) {
      operator_delete((void *)local_188._0_8_,local_178._0_8_ + 1);
    }
    if (local_b0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
    if (local_90.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_90.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_allocated_capacity != &local_1b8) {
      operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)encryption_key._M_dataplus._M_p != &encryption_key.field_2) {
      operator_delete(encryption_key._M_dataplus._M_p,
                      CONCAT71(encryption_key.field_2._M_allocated_capacity._1_7_,
                               encryption_key.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)Perms._M_dataplus._M_p != &Perms.field_2) {
      operator_delete(Perms._M_dataplus._M_p,
                      CONCAT71(Perms.field_2._M_allocated_capacity._1_7_,
                               Perms.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)UE._M_dataplus._M_p != &UE.field_2) {
      operator_delete(UE._M_dataplus._M_p,
                      CONCAT71(UE.field_2._M_allocated_capacity._1_7_,UE.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OE._M_dataplus._M_p != &OE.field_2) {
      operator_delete(OE._M_dataplus._M_p,
                      CONCAT71(OE.field_2._M_allocated_capacity._1_7_,OE.field_2._M_local_buf[0]) +
                      1);
    }
    if (encrypt.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (encrypt.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  if (trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (trailer.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
QPDFWriter::copyEncryptionParameters(QPDF& qpdf)
{
    m->preserve_encryption = false;
    QPDFObjectHandle trailer = qpdf.getTrailer();
    if (trailer.hasKey("/Encrypt")) {
        generateID();
        m->id1 = trailer.getKey("/ID").getArrayItem(0).getStringValue();
        QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
        int V = encrypt.getKey("/V").getIntValueAsInt();
        int key_len = 5;
        if (V > 1) {
            key_len = encrypt.getKey("/Length").getIntValueAsInt() / 8;
        }
        if (encrypt.hasKey("/EncryptMetadata") && encrypt.getKey("/EncryptMetadata").isBool()) {
            m->encrypt_metadata = encrypt.getKey("/EncryptMetadata").getBoolValue();
        }
        if (V >= 4) {
            // When copying encryption parameters, use AES even if the original file did not.
            // Acrobat doesn't create files with V >= 4 that don't use AES, and the logic of
            // figuring out whether AES is used or not is complicated with /StmF, /StrF, and /EFF
            // all potentially having different values.
            m->encrypt_use_aes = true;
        }
        QTC::TC("qpdf", "QPDFWriter copy encrypt metadata", m->encrypt_metadata ? 0 : 1);
        QTC::TC("qpdf", "QPDFWriter copy use_aes", m->encrypt_use_aes ? 0 : 1);
        std::string OE;
        std::string UE;
        std::string Perms;
        std::string encryption_key;
        if (V >= 5) {
            QTC::TC("qpdf", "QPDFWriter copy V5");
            OE = encrypt.getKey("/OE").getStringValue();
            UE = encrypt.getKey("/UE").getStringValue();
            Perms = encrypt.getKey("/Perms").getStringValue();
            encryption_key = qpdf.getEncryptionKey();
        }

        setEncryptionParametersInternal(
            V,
            encrypt.getKey("/R").getIntValueAsInt(),
            key_len,
            static_cast<int>(encrypt.getKey("/P").getIntValue()),
            encrypt.getKey("/O").getStringValue(),
            encrypt.getKey("/U").getStringValue(),
            OE,
            UE,
            Perms,
            m->id1, // m->id1 == the other file's id1
            qpdf.getPaddedUserPassword(),
            encryption_key);
    }
}